

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  Mem *pMem;
  bool bVar2;
  int iVar3;
  u32 matchOther;
  byte *pbVar4;
  u8 *zPattern;
  u8 *zString;
  int iVar5;
  compareInfo *pInfo;
  long in_FS_OFFSET;
  uchar *zEsc;
  byte *local_40;
  compareInfo local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = context->pOut->db;
  pInfo = (compareInfo *)context->pFunc->pUserData;
  local_34.matchAll = 0xaa;
  local_34.matchOne = 0xaa;
  local_34.matchSet = 0xaa;
  local_34.noCase = 0xaa;
  iVar3 = sqlite3ValueBytes(*argv,'\x01');
  if (psVar1->aLimit[8] < iVar3) {
    context->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      sqlite3VdbeMemSetStr
                (context->pOut,"LIKE or GLOB pattern too complex",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    goto LAB_001acfe1;
  }
  if (argc == 3) {
    local_40 = (byte *)sqlite3ValueText(argv[2],'\x01');
    matchOther = 0xaaaaaaaa;
    if (local_40 == (byte *)0x0) {
LAB_001acf01:
      bVar2 = false;
    }
    else {
      if (local_40 == (byte *)0xffffffffffffffff || *local_40 == 0) {
LAB_001aced8:
        context->isError = 1;
        sqlite3VdbeMemSetStr
                  (context->pOut,"ESCAPE expression must be a single character",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        goto LAB_001acf01;
      }
      pbVar4 = local_40;
      iVar3 = 0;
      do {
        iVar5 = iVar3;
        pbVar4 = pbVar4 + 1;
        if (pbVar4 == (byte *)0xffffffffffffffff) break;
        iVar3 = iVar5 + 1;
      } while (*pbVar4 != 0);
      if (iVar5 != 0) goto LAB_001aced8;
      matchOther = sqlite3Utf8Read(&local_40);
      if ((matchOther == pInfo->matchAll) || (bVar2 = true, matchOther == pInfo->matchOne)) {
        local_34 = *pInfo;
        if (matchOther == ((uint)local_34 & 0xff)) {
          local_34 = (compareInfo)((uint)local_34 & 0xffffff00);
        }
        pInfo = &local_34;
        bVar2 = true;
        if (matchOther == ((uint)local_34 >> 8 & 0xff)) {
          local_34.matchOne = '\0';
        }
      }
    }
    if (bVar2) goto LAB_001acf0e;
  }
  else {
    matchOther = (u32)pInfo->matchSet;
LAB_001acf0e:
    zPattern = (u8 *)sqlite3ValueText(*argv,'\x01');
    zString = (u8 *)sqlite3ValueText(argv[1],'\x01');
    if (zPattern != (u8 *)0x0 && zString != (u8 *)0x0) {
      iVar3 = patternCompare(zPattern,zString,pInfo,matchOther);
      pMem = context->pOut;
      if ((pMem->flags & 0x9000) == 0) {
        (pMem->u).i = (ulong)(iVar3 == 0);
        pMem->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMem,(ulong)(iVar3 == 0));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_001acfe1:
  __stack_chk_fail();
}

Assistant:

static void likeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);
  struct compareInfo backupInfo;

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context,
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
    if( escape==pInfo->matchAll || escape==pInfo->matchOne ){
      memcpy(&backupInfo, pInfo, sizeof(backupInfo));
      pInfo = &backupInfo;
      if( escape==pInfo->matchAll ) pInfo->matchAll = 0;
      if( escape==pInfo->matchOne ) pInfo->matchOne = 0;
    }
  }else{
    escape = pInfo->matchSet;
  }
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context,
                      patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}